

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.hpp
# Opt level: O0

bool __thiscall
beast::unit_test::runner::run_each<beast::unit_test::suite_list>(runner *this,suite_list *c)

{
  bool bVar1;
  reference s_00;
  bool local_49;
  suite_info *s;
  const_iterator __end0;
  const_iterator __begin0;
  suite_list *__range2;
  bool failed;
  suite_list *c_local;
  runner *this_local;
  
  __range2._7_1_ = false;
  __end0 = unit_test::detail::
           const_container<std::set<beast::unit_test::suite_info,_std::less<beast::unit_test::suite_info>,_std::allocator<beast::unit_test::suite_info>_>_>
           ::begin(&c->
                    super_const_container<std::set<beast::unit_test::suite_info,_std::less<beast::unit_test::suite_info>,_std::allocator<beast::unit_test::suite_info>_>_>
                  );
  s = (suite_info *)
      unit_test::detail::
      const_container<std::set<beast::unit_test::suite_info,_std::less<beast::unit_test::suite_info>,_std::allocator<beast::unit_test::suite_info>_>_>
      ::end(&c->
             super_const_container<std::set<beast::unit_test::suite_info,_std::less<beast::unit_test::suite_info>,_std::allocator<beast::unit_test::suite_info>_>_>
           );
  while( true ) {
    bVar1 = std::operator!=(&__end0,(_Self *)&s);
    if (!bVar1) break;
    s_00 = std::_Rb_tree_const_iterator<beast::unit_test::suite_info>::operator*(&__end0);
    bVar1 = run<void>(this,s_00);
    local_49 = true;
    if (!bVar1) {
      local_49 = __range2._7_1_;
    }
    __range2._7_1_ = local_49;
    std::_Rb_tree_const_iterator<beast::unit_test::suite_info>::operator++(&__end0);
  }
  return __range2._7_1_;
}

Assistant:

bool
runner::run_each(SequenceContainer const& c)
{
    bool failed(false);
    for(auto const& s : c)
        failed = run(s) || failed;
    return failed;
}